

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O0

int store_compressed(File *f,int inSize,uint8_t *target,uint8_t *sha)

{
  int iVar1;
  fastzip_exception *this;
  undefined1 auStack_1011c [8];
  SHA_CTX context;
  undefined1 auStack_100b0 [8];
  mz_stream stream;
  undefined1 auStack_10038 [4];
  int bufSize;
  uint8_t buf [65536];
  int total;
  uint8_t *fileData;
  uint8_t *sha_local;
  uint8_t *target_local;
  int inSize_local;
  File *f_local;
  
  File::Read<unsigned_char>(f,target,(long)inSize);
  buf[0xfffc] = '\0';
  buf[0xfffd] = '\0';
  buf[0xfffe] = '\0';
  buf[0xffff] = '\0';
  if (sha != (uint8_t *)0x0) {
    stream.reserved._4_4_ = 0x10000;
    memset(auStack_100b0,0,0x70);
    iVar1 = mz_inflateInit2((mz_streamp)auStack_100b0,-0xf);
    if (iVar1 != 0) {
      this = (fastzip_exception *)__cxa_allocate_exception(0x10);
      fastzip_exception::fastzip_exception(this,"Could not init miniz for compression");
      __cxa_throw(this,&fastzip_exception::typeinfo,fastzip_exception::~fastzip_exception);
    }
    auStack_100b0 = (undefined1  [8])target;
    stream.next_in._0_4_ = inSize;
    SHA1_Init((SHA_CTX *)auStack_1011c);
    while ((int)stream.next_in != 0) {
      stream.total_in = (mz_ulong)auStack_10038;
      stream.next_out._0_4_ = 0x10000;
      mz_inflate((mz_streamp)auStack_100b0,2);
      SHA1_Update((SHA_CTX *)auStack_1011c,auStack_10038,(ulong)(0x10000 - (int)stream.next_out));
      buf._65532_4_ = (0x10000 - (int)stream.next_out) + buf._65532_4_;
    }
    mz_inflate((mz_streamp)auStack_100b0,4);
    SHA1_Final(sha,(SHA_CTX *)auStack_1011c);
  }
  iVar1._0_1_ = buf[0xfffc];
  iVar1._1_1_ = buf[0xfffd];
  iVar1._2_1_ = buf[0xfffe];
  iVar1._3_1_ = buf[0xffff];
  return iVar1;
}

Assistant:

static int store_compressed(File& f, int inSize, uint8_t* target, uint8_t* sha)
{
    uint8_t* fileData = target;
    f.Read(fileData, inSize);

    int total = 0;
    if (sha) {
        uint8_t buf[65536];
        const int bufSize = sizeof(buf);

        mz_stream stream;
        memset(&stream, 0, sizeof(stream));
        if (mz_inflateInit2(&stream, -MZ_DEFAULT_WINDOW_BITS) != MZ_OK)
            throw fastzip_exception("Could not init miniz for compression");

        stream.next_in = fileData;
        stream.avail_in = inSize;

        SHA_CTX context;
        SHA1_Init(&context);

        while (stream.avail_in > 0) {
            stream.next_out = buf;
            stream.avail_out = bufSize;
            mz_inflate(&stream, MZ_SYNC_FLUSH);
            SHA1_Update(&context, buf, bufSize - stream.avail_out);
            total += (bufSize - stream.avail_out);
        }

        mz_inflate(&stream, MZ_FINISH);

        SHA1_Final(sha, &context);
    }
    return total;
}